

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_optimizations.cpp
# Opt level: O1

void duckdb::AddCodepoint(int32_t codepoint,LikeString *ret,bool contains)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  int sz;
  char utf8_str [4];
  int local_30;
  byte local_2c [4];
  
  local_30 = 0;
  bVar2 = Utf8Proc::CodepointToUtf8(codepoint,&local_30,(char *)local_2c);
  if (bVar2) {
    if (local_30 != 0) {
      uVar4 = 0;
      do {
        bVar1 = local_2c[uVar4];
        iVar3 = iscntrl((uint)bVar1);
        if ((iVar3 == 0) && ((contains || ((bVar1 != 0x5f && (bVar1 != 0x25)))))) {
          ::std::__cxx11::string::push_back((char)ret + '\b');
        }
        else {
          ret->exists = false;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < (ulong)(long)local_30);
    }
  }
  else {
    ret->exists = false;
  }
  return;
}

Assistant:

static void AddCodepoint(int32_t codepoint, LikeString &ret, bool contains) {
	int sz = 0;
	char utf8_str[4];
	if (!Utf8Proc::CodepointToUtf8(codepoint, sz, utf8_str)) {
		// invalid codepoint
		ret.exists = false;
		return;
	}
	for (idx_t i = 0; i < idx_t(sz); i++) {
		AddCharacter(utf8_str[i], ret, contains);
	}
}